

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::ParseableFunctionInfo::SetDeferredParsingEntryPoint(ParseableFunctionInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptMethod p_Var4;
  
  p_Var4 = ((this->super_FunctionProxy).m_scriptContext)->DeferredParsingThunk;
  if (p_Var4 != JavascriptFunction::DeferredParsingThunk &&
      p_Var4 != ScriptContext::ProfileModeDeferredParsingThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xeb8,
                                "(m_scriptContext->DeferredParsingThunk == Js::ScriptContext::ProfileModeDeferredParsingThunk || m_scriptContext->DeferredParsingThunk == Js::JavascriptFunction::DeferredParsingThunk)"
                                ,
                                "m_scriptContext->DeferredParsingThunk == ProfileDeferredParsingThunk || m_scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    p_Var4 = ((this->super_FunctionProxy).m_scriptContext)->DeferredParsingThunk;
  }
  ((this->super_FunctionProxy).m_defaultEntryPointInfo.ptr)->jsMethod = (Type)p_Var4;
  FunctionProxy::SetOriginalEntryPoint
            (&this->super_FunctionProxy,JavascriptFunction::DeferredParsingThunk);
  return;
}

Assistant:

void ParseableFunctionInfo::SetDeferredParsingEntryPoint()
    {
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
        Assert(m_scriptContext->DeferredParsingThunk == ProfileDeferredParsingThunk
            || m_scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk);
#else
        Assert(m_scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk);
#endif

        this->SetEntryPoint(this->GetDefaultEntryPointInfo(), m_scriptContext->DeferredParsingThunk);
        this->SetOriginalEntryPoint(DefaultDeferredParsingThunk);
    }